

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindFileCommand.cxx
# Opt level: O0

void __thiscall
cmFindFileCommand::cmFindFileCommand(cmFindFileCommand *this,cmExecutionStatus *status)

{
  allocator<char> local_39;
  string local_38;
  cmExecutionStatus *local_18;
  cmExecutionStatus *status_local;
  cmFindFileCommand *this_local;
  
  local_18 = status;
  status_local = (cmExecutionStatus *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"find_file",&local_39);
  cmFindPathCommand::cmFindPathCommand(&this->super_cmFindPathCommand,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_cmFindPathCommand).super_cmFindBase._vptr_cmFindBase =
       (_func_int **)&PTR__cmFindFileCommand_00f4b9d0;
  (this->super_cmFindPathCommand).IncludeFileInPath = true;
  (this->super_cmFindPathCommand).super_cmFindBase.VariableType = FILEPATH;
  return;
}

Assistant:

cmFindFileCommand::cmFindFileCommand(cmExecutionStatus& status)
  : cmFindPathCommand("find_file", status)
{
  this->IncludeFileInPath = true;
  this->VariableType = cmStateEnums::FILEPATH;
}